

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::remove_time_critical_pieces
          (torrent *this,vector<download_priority_t,_piece_index_t> *priority)

{
  iterator this_00;
  bool bVar1;
  pointer ptVar2;
  value_type *this_01;
  alert_manager *this_02;
  error_category *cat;
  const_iterator local_70;
  time_critical_piece *local_68;
  error_code local_50;
  undefined1 local_40 [19];
  bitfield_flag local_2d;
  int local_2c;
  __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
  local_28;
  __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
  local_20;
  iterator i;
  vector<download_priority_t,_piece_index_t> *priority_local;
  torrent *this_local;
  
  i._M_current = (time_critical_piece *)priority;
  local_20._M_current =
       (time_critical_piece *)
       ::std::
       vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
       ::begin(&this->m_time_critical_pieces);
  while( true ) {
    local_28._M_current =
         (time_critical_piece *)
         ::std::
         vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
         ::end(&this->m_time_critical_pieces);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    this_00 = i;
    if (!bVar1) break;
    ptVar2 = __gnu_cxx::
             __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
             ::operator->(&local_20);
    local_2c = (ptVar2->piece).m_val;
    this_01 = container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
              ::operator[]((container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
                            *)this_00._M_current,
                           (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)local_2c);
    bVar1 = strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>::operator==
                      (this_01,(strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>
                                *)&dont_download);
    if (bVar1) {
      ptVar2 = __gnu_cxx::
               __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
               ::operator->(&local_20);
      local_40[0x12] = (ptVar2->flags).m_val;
      local_40[0x11] = '\x01';
      local_2d = (bitfield_flag)
                 libtorrent::flags::operator&
                           (local_40[0x12],
                            (bitfield_flag<unsigned_char,_libtorrent::deadline_flags_tag,_void>)
                            '\x01');
      bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_2d);
      if (bVar1) {
        this_02 = alerts(this);
        get_handle((torrent *)local_40);
        ptVar2 = __gnu_cxx::
                 __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
                 ::operator->(&local_20);
        cat = boost::system::generic_category();
        boost::system::error_code::error_code(&local_50,0x7d,cat);
        alert_manager::
        emplace_alert<libtorrent::read_piece_alert,libtorrent::torrent_handle,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>&,boost::system::error_code>
                  (this_02,(torrent_handle *)local_40,&ptVar2->piece,&local_50);
        torrent_handle::~torrent_handle((torrent_handle *)local_40);
      }
      __gnu_cxx::
      __normal_iterator<libtorrent::aux::time_critical_piece_const*,std::vector<libtorrent::aux::time_critical_piece,std::allocator<libtorrent::aux::time_critical_piece>>>
      ::__normal_iterator<libtorrent::aux::time_critical_piece*>
                ((__normal_iterator<libtorrent::aux::time_critical_piece_const*,std::vector<libtorrent::aux::time_critical_piece,std::allocator<libtorrent::aux::time_critical_piece>>>
                  *)&local_70,&local_20);
      local_68 = (time_critical_piece *)
                 ::std::
                 vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
                 ::erase(&this->m_time_critical_pieces,local_70);
      local_20._M_current = local_68;
    }
    else {
      __gnu_cxx::
      __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
      ::operator++(&local_20);
    }
  }
  return;
}

Assistant:

void torrent::remove_time_critical_pieces(aux::vector<download_priority_t, piece_index_t> const& priority)
	{
		for (auto i = m_time_critical_pieces.begin(); i != m_time_critical_pieces.end();)
		{
			if (priority[i->piece] == dont_download)
			{
				if (i->flags & torrent_handle::alert_when_available)
				{
					// post an empty read_piece_alert to indicate it failed
					alerts().emplace_alert<read_piece_alert>(
						get_handle(), i->piece, error_code(boost::system::errc::operation_canceled, generic_category()));
				}
				i = m_time_critical_pieces.erase(i);
				continue;
			}
			++i;
		}
	}